

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_buffer_decode(aec_stream_conflict *strm)

{
  int status;
  aec_stream_conflict *strm_local;
  
  strm_local._4_4_ = aec_decode_init(strm);
  if (strm_local._4_4_ == 0) {
    strm_local._4_4_ = aec_decode(strm,1);
    aec_decode_end(strm);
  }
  return strm_local._4_4_;
}

Assistant:

int aec_buffer_decode(struct aec_stream *strm)
{
    int status = aec_decode_init(strm);
    if (status != AEC_OK)
        return status;

    status = aec_decode(strm, AEC_FLUSH);
    aec_decode_end(strm);
    return status;
}